

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

size_t __thiscall
llama_context::state_seq_set_data(llama_context *this,llama_seq_id seq_id,uint8_t *src,size_t size)

{
  int iVar1;
  undefined4 extraout_var;
  llama_io_read_buffer io;
  llama_io_read_i local_28;
  uint8_t *local_20;
  size_t local_18;
  undefined8 local_10;
  
  local_28._vptr_llama_io_read_i = (_func_int **)&PTR__llama_io_read_i_00285660;
  local_10 = 0;
  local_20 = src;
  local_18 = size;
  llama_kv_cache_unified::state_read
            ((this->kv_self)._M_t.
             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
             ._M_t.
             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,&local_28,seq_id);
  iVar1 = (*local_28._vptr_llama_io_read_i[4])();
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t llama_context::state_seq_set_data(llama_seq_id seq_id, const uint8_t * src, size_t size) {
    llama_io_read_buffer io(src, size);
    try {
        return state_seq_read_data(io, seq_id);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error loading state: %s\n", __func__, err.what());
        return 0;
    }
}